

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

void __thiscall
google::
dense_hashtable<A,_A,_HashA,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::Identity,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>
::set_empty_key(dense_hashtable<A,_A,_HashA,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::Identity,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>
                *this,key_type *key)

{
  size_type count;
  pointer table_start;
  
  (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.use_empty_ = true;
  (this->key_info).empty_key._i = key->_i;
  A::copy_assign = A::copy_assign + 1;
  count = this->num_buckets;
  table_start = (pointer)malloc(count * 4);
  this->table = table_start;
  fill_range_with_empty(this,table_start,count);
  return;
}

Assistant:

void set_empty_key(const key_type& key) {
    // Once you set the empty key, you can't change it
    assert(!settings.use_empty() && "Calling set_empty_key multiple times");
    // The deleted indicator (if specified) and the empty indicator
    // must be different.
    assert(
        (!settings.use_deleted() || !equals(key, key_info.delkey)) &&
        "Setting the empty key the same as the deleted key");
    settings.set_use_empty(true);
    key_info.empty_key = key;

    assert(!table);  // must set before first use
    // num_buckets was set in constructor even though table was NULL
    table = val_info.allocate(num_buckets);
    assert(table);
    fill_range_with_empty(table, num_buckets);
  }